

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

QString * __thiscall
ProjectBuilderMakefileGenerator::fixForOutput
          (QString *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,QString *values)

{
  long lVar1;
  QMakeProject *pQVar2;
  Data *pDVar3;
  char cVar4;
  int iVar5;
  QList<ProString> *pQVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c0;
  ProString local_a8;
  QArrayDataPointer<char16_t> local_78 [2];
  QRegularExpressionMatch match;
  QRegularExpression reg_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _reg_var = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)local_78,"\\$\\((.*)\\)");
  iVar5 = 0;
  QRegularExpression::QRegularExpression(&reg_var,local_78,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_78);
  _match = (Data *)0xaaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch(&match);
  while( true ) {
    QRegularExpression::match(local_78,&reg_var,values,(long)iVar5,0,0);
    pDVar3 = _match;
    _match = local_78[0].d;
    local_78[0].d = pDVar3;
    cVar4 = QRegularExpressionMatch::hasMatch();
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)local_78);
    if (cVar4 == '\0') break;
    pQVar2 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_PBX_VARS");
    pQVar6 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_78)->
              super_QList<ProString>;
    QRegularExpressionMatch::captured((int)&local_a8);
    qVar7 = QtPrivate::indexOf<ProString,QString>(pQVar6,&local_a8.m_string,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_78);
    if (qVar7 == -1) {
      pQVar2 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_PBX_VARS");
      pQVar6 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_78)->
                super_QList<ProString>;
      QRegularExpressionMatch::captured((int)&local_c0);
      ProString::ProString(&local_a8,(QString *)&local_c0);
      QList<ProString>::emplaceBack<ProString>(pQVar6,&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_78);
    }
    iVar5 = QRegularExpressionMatch::capturedEnd((int)&match);
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&values->d);
  QRegularExpressionMatch::~QRegularExpressionMatch(&match);
  QRegularExpression::~QRegularExpression(&reg_var);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::fixForOutput(const QString &values)
{
    //get the environment variables references
    QRegularExpression reg_var("\\$\\((.*)\\)");
    QRegularExpressionMatch match;
    for (int rep = 0; (match = reg_var.match(values, rep)).hasMatch();) {
        if (project->values("QMAKE_PBX_VARS").indexOf(match.captured(1)) == -1)
            project->values("QMAKE_PBX_VARS").append(match.captured(1));
        rep = match.capturedEnd();
    }

    return values;
}